

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O0

Pipeline * __thiscall
n_e_s::core::Mos6502::create_store_instruction
          (Pipeline *__return_storage_ptr__,Mos6502 *this,Opcode opcode)

{
  Family family;
  anon_class_24_3_c2b0929d local_f0;
  StepT local_d8;
  uint8_t *local_b8;
  uint8_t *reg2;
  uint8_t *reg;
  Pipeline local_98;
  undefined1 local_3d;
  MemoryAccess local_3c;
  Mos6502 *pMStack_38;
  MemoryAccess memory_access;
  Mos6502 *this_local;
  AddressMode local_28;
  Mos6502 *local_20;
  Opcode opcode_local;
  Pipeline *result;
  
  local_28 = opcode.address_mode;
  this_local = opcode._0_8_;
  local_20._0_4_ = opcode.family;
  family = (Family)local_20;
  pMStack_38 = this;
  local_20 = this_local;
  opcode_local.family = local_28;
  unique0x10000163 = __return_storage_ptr__;
  local_3c = get_memory_access(family);
  local_3d = 0;
  Pipeline::Pipeline(__return_storage_ptr__);
  create_addressing_steps(&local_98,this,opcode_local.family,local_3c);
  Pipeline::append(__return_storage_ptr__,&local_98);
  Pipeline::~Pipeline(&local_98);
  reg2 = (uint8_t *)0x0;
  local_b8 = (uint8_t *)0x0;
  if ((Family)local_20 == 0x1a) {
    reg2 = &this->registers_->x;
  }
  else if ((Family)local_20 == 0x18) {
    reg2 = &this->registers_->y;
  }
  else if ((Family)local_20 == 0x19) {
    reg2 = &this->registers_->a;
  }
  else if ((Family)local_20 == 0x3a) {
    reg2 = &this->registers_->a;
    local_b8 = &this->registers_->x;
  }
  local_f0.reg = reg2;
  local_f0.reg2 = local_b8;
  local_f0.this = this;
  std::function<void()>::
  function<n_e_s::core::Mos6502::create_store_instruction(n_e_s::core::Opcode)::__0,void>
            ((function<void()> *)&local_d8,&local_f0);
  Pipeline::push(__return_storage_ptr__,&local_d8);
  std::function<void_()>::~function(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_store_instruction(Opcode opcode) {
    const MemoryAccess memory_access = get_memory_access(opcode.family);
    Pipeline result;
    result.append(create_addressing_steps(opcode.address_mode, memory_access));

    uint8_t *reg{};
    uint8_t *reg2{};
    if (opcode.family == Family::STX) {
        reg = &registers_->x;
    } else if (opcode.family == Family::STY) {
        reg = &registers_->y;
    } else if (opcode.family == Family::STA) {
        reg = &registers_->a;
    } else if (opcode.family == Family::SAX) {
        reg = &registers_->a;
        reg2 = &registers_->x;
    }
    result.push([this, reg, reg2] {
        const uint8_t value = reg2 == nullptr ? *reg : *reg & *reg2;
        mmu_->write_byte(effective_address_, value);
    });

    return result;
}